

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

void __thiscall QTextBrowserPrivate::highlightLink(QTextBrowserPrivate *this,QString *anchor)

{
  long lVar1;
  QWidget *this_00;
  int iVar2;
  long in_FS_OFFSET;
  QUrl url;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((anchor->d).size == 0) {
    QWidget::cursor((QWidget *)&url);
    iVar2 = QCursor::shape();
    QCursor::~QCursor((QCursor *)&url);
    if (iVar2 != 0xd) {
      QWidget::cursor((QWidget *)&url);
      QCursor::operator=(&this->oldCursor,(QCursor *)&url);
      QCursor::~QCursor((QCursor *)&url);
    }
    QWidget::setCursor((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport,
                       &this->oldCursor);
    QUrl::QUrl(&url);
    emitHighlighted(this,&url);
  }
  else {
    this_00 = (this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport;
    QCursor::QCursor((QCursor *)&url,PointingHandCursor);
    QWidget::setCursor(this_00,(QCursor *)&url);
    QCursor::~QCursor((QCursor *)&url);
    url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    resolveUrl((QTextBrowserPrivate *)&url,(QString *)this);
    emitHighlighted(this,&url);
  }
  QUrl::~QUrl(&url);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::highlightLink(const QString &anchor)
{
    if (anchor.isEmpty()) {
#ifndef QT_NO_CURSOR
        if (viewport->cursor().shape() != Qt::PointingHandCursor)
            oldCursor = viewport->cursor();
        viewport->setCursor(oldCursor);
#endif
        emitHighlighted(QUrl());
    } else {
#ifndef QT_NO_CURSOR
        viewport->setCursor(Qt::PointingHandCursor);
#endif

        const QUrl url = resolveUrl(anchor);
        emitHighlighted(url);
    }
}